

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O0

exr_result_t exr_set_compression(exr_context_t ctxt,int part_index,exr_compression_t ctype)

{
  _internal_exr_part *p_Var1;
  exr_result_t eVar2;
  exr_compression_t in_EDX;
  uint in_ESI;
  _internal_exr_context *in_RDI;
  int32_t unaff_retaddr;
  exr_attribute_type_t unaff_retaddr_00;
  char *in_stack_00000008;
  _internal_exr_part *part;
  _internal_exr_context *pctxt;
  exr_result_t rv;
  exr_attribute_t *attr;
  int local_24;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  local_24 = 0;
  if (in_RDI == (_internal_exr_context *)0x0) {
    local_24 = 2;
  }
  else {
    internal_exr_lock(in_RDI);
    if (((int)in_ESI < 0) || (in_RDI->num_parts <= (int)in_ESI)) {
      internal_exr_unlock(in_RDI);
      local_24 = (*in_RDI->print_error)(in_RDI,4,"Part index (%d) out of range",(ulong)in_ESI);
    }
    else {
      p_Var1 = in_RDI->parts[(int)in_ESI];
      if (in_RDI->mode == '\0') {
        internal_exr_unlock(in_RDI);
        local_24 = (*in_RDI->standard_error)(in_RDI,8);
      }
      else if (in_RDI->mode == '\x03') {
        internal_exr_unlock(in_RDI);
        local_24 = (*in_RDI->standard_error)(in_RDI,0x15);
      }
      else {
        if (p_Var1->compression == (exr_attribute_t *)0x0) {
          local_24 = exr_attr_list_add((exr_context_t)pctxt,(exr_attribute_list_t *)part,
                                       in_stack_00000008,unaff_retaddr_00,unaff_retaddr,
                                       (uint8_t **)
                                       CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                                       ,(exr_attribute_t **)CONCAT44(part_index,ctype));
        }
        else if (p_Var1->compression->type != EXR_ATTR_COMPRESSION) {
          internal_exr_unlock(in_RDI);
          eVar2 = (*in_RDI->print_error)
                            (in_RDI,6,"Invalid required attribute type \'%s\' for \'%s\'",
                             p_Var1->compression->type_name,"compression");
          return eVar2;
        }
        if (local_24 == 0) {
          (p_Var1->compression->field_6).uc = (uint8_t)in_EDX;
          p_Var1->comp_type = in_EDX;
        }
        internal_exr_unlock(in_RDI);
      }
    }
  }
  return local_24;
}

Assistant:

exr_result_t
exr_set_compression (
    exr_context_t ctxt, int part_index, exr_compression_t ctype)
{
    REQ_ATTR_FIND_CREATE (compression, EXR_ATTR_COMPRESSION);
    if (rv == EXR_ERR_SUCCESS)
    {
        attr->uc        = (uint8_t) ctype;
        part->comp_type = ctype;
    }
    return EXR_UNLOCK_AND_RETURN_PCTXT (rv);
}